

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void log_command(int cmd,int rep,nh_cmd_arg *arg)

{
  uint uVar1;
  nh_direction nVar2;
  char *fmt;
  
  if ((iflags.disable_log == '\0') && (logfile != -1)) {
    lprintf("\n>%llx:%x:%d ",turntime,(ulong)(cmd + 1),rep);
    uVar1 = arg->argtype - 2;
    switch(uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f) {
    case 0:
      lprintf("n");
      return;
    case 1:
      nVar2 = (arg->field_1).d;
      fmt = "d:%d";
      break;
    default:
      goto switchD_001b041a_caseD_2;
    case 3:
      lprintf("p:%x:%x",(ulong)(uint)(int)(arg->field_1).pos.x,
              (ulong)(uint)(int)(arg->field_1).pos.y);
      return;
    case 7:
      nVar2 = (nh_direction)(arg->field_1).invlet;
      fmt = "o:%c";
    }
    lprintf(fmt,(ulong)(uint)nVar2);
    return;
  }
switchD_001b041a_caseD_2:
  return;
}

Assistant:

void log_command(int cmd, int rep, struct nh_cmd_arg *arg)
{
    if (iflags.disable_log || logfile == -1)
	return;
    
    /* command numbers are shifted by 1, so that they can be array indices during replay */
    lprintf("\n>%llx:%x:%d ", turntime, cmd+1, rep);
    switch (arg->argtype) {
	case CMD_ARG_NONE:
	    lprintf("n");
	    break;
	case CMD_ARG_DIR:
	    lprintf("d:%d", arg->d);
	    break;
	case CMD_ARG_POS:
	    lprintf("p:%x:%x", arg->pos.x, arg->pos.y);
	    break;
	case CMD_ARG_OBJ:
	    lprintf("o:%c", arg->invlet);
	    break;
    }
}